

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O3

void __thiscall
TPZTensor<TFad<6,_double>_>::EigenSystem
          (TPZTensor<TFad<6,_double>_> *this,TPZDecomposed *eigensystem)

{
  TPZManVector<TFad<6,_double>,_6> *this_00;
  TFad<6,_double> *pTVar1;
  TPZTensor<TFad<6,_double>_> *pTVar2;
  int **ppiVar3;
  int *piVar4;
  TFad<6,_double> *pTVar5;
  TPZStack<int,_3> *__range2;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  TFad<6,_double> *pTVar9;
  double dVar10;
  int i_1;
  TFad<6,_double> *pTVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint i;
  long lVar16;
  TPZStack<int,_3> indices_to_add;
  TPZTensor<TFad<6,_double>_> sum;
  TPZVec<int> local_248;
  int local_228 [4];
  TFad<6,_double> local_218;
  undefined1 local_1d8 [16];
  double local_1c8;
  
  Norm((TFad<6,_double> *)local_1d8,this);
  ComputeEigenvectors(this,eigensystem);
  lVar12 = 0;
  TPZVec<int>::TPZVec(&local_248,0);
  piVar7 = local_228;
  local_248.fNElements = 0;
  local_248.fNAlloc = 0;
  local_248._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01877b48;
  lVar16 = 0;
  local_248.fStore = piVar7;
  do {
    if ((eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore[lVar16] != 1) {
      (*local_248._vptr_TPZVec[3])(&local_248);
      local_248.fStore[local_248.fNElements + -1] = (int)lVar16;
      piVar7 = local_248.fStore;
      lVar12 = local_248.fNElements;
    }
    pTVar1 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>.fStore
             [lVar16].super_TPZVec<TFad<6,_double>_>.fStore;
    pTVar9 = (eigensystem->fEigentensors).super_TPZVec<TPZTensor<TFad<6,_double>_>_>.fStore[lVar16].
             fData.super_TPZVec<TFad<6,_double>_>.fStore;
    uVar13 = 0;
    pTVar11 = pTVar1;
    uVar8 = uVar13;
    pTVar5 = pTVar1;
    do {
      do {
        uVar14 = uVar13;
        if (uVar13 < uVar8) {
          uVar14 = uVar8;
        }
        uVar6 = uVar13;
        if (uVar8 < uVar13) {
          uVar6 = uVar8;
        }
        uVar6 = (5 - uVar6) * uVar6 & 0x7fffffffffffffe;
        lVar15 = 2;
        do {
          pTVar9[uVar14].dx_[uVar6 * 4 + lVar15 + -2] =
               pTVar5->dx_[lVar15 + -2] * pTVar1[uVar13].val_ +
               pTVar11->dx_[lVar15 + -2] * pTVar1[uVar8].val_;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 8);
        pTVar9[uVar14].dx_[uVar6 * 4 + -1] = pTVar1[uVar8].val_ * pTVar1[uVar13].val_;
        uVar13 = uVar13 + 1;
        pTVar11 = pTVar11 + 1;
      } while (uVar13 != 3);
      uVar13 = uVar8 + 1;
      pTVar11 = pTVar5 + 1;
      uVar8 = uVar13;
      pTVar5 = pTVar11;
    } while (uVar13 != 3);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  if (0 < lVar12) {
    this_00 = (TPZManVector<TFad<6,_double>,_6> *)(local_1d8 + 8);
    local_1d8._0_8_ = &PTR__TPZTensor_018777a0;
    local_218.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
    local_218.val_ = 0.0;
    local_218.dx_[0] = 0.0;
    local_218.dx_[1] = 0.0;
    local_218.dx_[2] = 0.0;
    local_218.dx_[3] = 0.0;
    local_218.dx_[4] = 0.0;
    local_218.dx_[5] = 0.0;
    TPZManVector<TFad<6,_double>,_6>::TPZManVector(this_00,6,&local_218);
    ppiVar3 = TPZVec<int>::begin(&local_248);
    piVar7 = *ppiVar3;
    piVar4 = TPZVec<int>::end(&local_248);
    if (piVar7 != piVar4) {
      pTVar2 = (eigensystem->fEigentensors).super_TPZVec<TPZTensor<TFad<6,_double>_>_>.fStore;
      do {
        pTVar1 = pTVar2[*piVar7].fData.super_TPZVec<TFad<6,_double>_>.fStore;
        lVar12 = 0;
        pTVar9 = pTVar1;
        dVar10 = local_1c8;
        do {
          lVar16 = 2;
          do {
            *(double *)((long)dVar10 + 0x10 + (lVar16 + -2) * 8) =
                 pTVar9->dx_[lVar16 + -2] + *(double *)((long)dVar10 + 0x10 + (lVar16 + -2) * 8);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 8);
          *(double *)((long)local_1c8 + lVar12 * 0x40 + 8) =
               pTVar1[lVar12].val_ + *(double *)((long)local_1c8 + lVar12 * 0x40 + 8);
          lVar12 = lVar12 + 1;
          dVar10 = (double)((long)dVar10 + 0x40);
          pTVar9 = pTVar9 + 1;
        } while (lVar12 != 6);
        piVar7 = piVar7 + 1;
      } while (piVar7 != piVar4);
    }
    ppiVar3 = TPZVec<int>::begin(&local_248);
    piVar7 = *ppiVar3;
    piVar4 = TPZVec<int>::end(&local_248);
    for (; piVar7 != piVar4; piVar7 = piVar7 + 1) {
      TPZManVector<TFad<6,_double>,_6>::operator=
                (&(eigensystem->fEigentensors).super_TPZVec<TPZTensor<TFad<6,_double>_>_>.fStore
                  [*piVar7].fData,this_00);
    }
    local_1d8._0_8_ = &PTR__TPZTensor_018777a0;
    TPZManVector<TFad<6,_double>,_6>::~TPZManVector(this_00);
    piVar7 = local_248.fStore;
  }
  if (piVar7 != local_228) {
    local_248.fNAlloc = 0;
    local_248._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (piVar7 != (int *)0x0) {
      operator_delete__(piVar7);
    }
  }
  return;
}

Assistant:

void TPZTensor<T>::EigenSystem(TPZDecomposed &eigensystem)const {
    TPZManVector<T, 3> &eigenvalues = eigensystem.fEigenvalues;
    TPZManVector<TPZTensor<T>, 3> &eigentensors = eigensystem.fEigentensors;

    T precision;
    ZeroTolerance(precision);
    T tol = Norm()*precision;
    ComputeEigenvectors(eigensystem);

    TPZStack<int, 3> indices_to_add;
    for (unsigned int i = 0; i < 3; ++i) {
        if (eigensystem.fGeometricMultiplicity[i] != 1) {
            indices_to_add.push_back(i);
        }
        for (unsigned int j = 0; j < 3; ++j) {
            for (unsigned int k = j; k < 3; ++k) {
                eigentensors[i](j, k) = eigensystem.fEigenvectors[i][j] * eigensystem.fEigenvectors[i][k];
            }
        }
    }
    if (indices_to_add.size() > 0) {
        TPZTensor<T> sum;
        for (auto i : indices_to_add) {
            sum += eigentensors[i];
        }
        for (auto i : indices_to_add) {
            eigentensors[i] = sum;
        }
    }
#ifdef PZDEBUG
    TPZTensor<T> total;
    unsigned int i;
    for (i = 0; i < 3; i += eigensystem.fGeometricMultiplicity[i]) {
        total.Add(eigentensors[i], eigenvalues[i]);
    }
    if (i != 3) {
        std::cout << "Tensor decomposition error: " << std::endl;
        std::cout << "Incorrect total geometric multiplicity: " << i << std::endl;
        DebugStop();
    }
    for (unsigned int i = 0; i < 6; ++i) {
        if (!AreEqual(total[i], this->operator[](i), tol)) {
            std::cout << std::setprecision(15);
            std::cout << "Tensor decomposition error: " << std::endl;
            std::cout << "Original Tensor: ";
            this->Print(std::cout);
            std::cout << "Reconstruction from decomposition: ";
            total.Print(std::cout);
            std::cout << "Decomposition: " << std::endl;
            eigensystem.Print(std::cout);
            DebugStop();
        }
    }
#endif
}